

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logger::~Logger(Logger *this)

{
  string *v;
  char *pcVar1;
  LogStream *pLVar2;
  char **ppcVar3;
  Buffer *msg;
  
  ppcVar3 = &(this->impl_).stream_.buffer_.cur_;
  pcVar1 = (this->impl_).stream_.buffer_.cur_;
  if (8 < (int)ppcVar3 - (int)pcVar1) {
    builtin_strncpy(pcVar1," -- ",5);
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *ppcVar3 = *ppcVar3 + 8;
  }
  v = &(this->impl_).basename_;
  pLVar2 = LogStream::operator<<((LogStream *)this,v);
  ppcVar3 = &(pLVar2->buffer_).cur_;
  pcVar1 = (pLVar2->buffer_).cur_;
  if (8 < (int)ppcVar3 - (int)pcVar1) {
    pcVar1[0] = ':';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *ppcVar3 = *ppcVar3 + 8;
  }
  pLVar2 = LogStream::operator<<(pLVar2,(this->impl_).line_);
  ppcVar3 = &(pLVar2->buffer_).cur_;
  pcVar1 = (pLVar2->buffer_).cur_;
  if (1 < (int)ppcVar3 - (int)pcVar1) {
    *pcVar1 = '\n';
    *ppcVar3 = *ppcVar3 + 1;
  }
  msg = &(this->impl_).stream_.buffer_;
  output(msg->data_,*(int *)&(this->impl_).stream_.buffer_.cur_ - (int)msg);
  std::__cxx11::string::~string((string *)v);
  return;
}

Assistant:

Logger::~Logger(){
    impl_.stream_<<" -- "<<impl_.basename_<<":"<<impl_.line_<<'\n';
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}